

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCSat2.c
# Opt level: O0

void Cbs2_QuePush(Cbs2_Que_t *p,int iObj)

{
  int iVar1;
  int *local_20;
  int iObj_local;
  Cbs2_Que_t *p_local;
  
  if (p->iTail == p->nSize) {
    p->nSize = p->nSize << 1;
    if (p->pData == (int *)0x0) {
      local_20 = (int *)malloc((long)p->nSize << 2);
    }
    else {
      local_20 = (int *)realloc(p->pData,(long)p->nSize << 2);
    }
    p->pData = local_20;
  }
  iVar1 = p->iTail;
  p->iTail = iVar1 + 1;
  p->pData[iVar1] = iObj;
  return;
}

Assistant:

static inline void Cbs2_QuePush( Cbs2_Que_t * p, int iObj )
{
    if ( p->iTail == p->nSize )
    {
        p->nSize *= 2;
        p->pData = ABC_REALLOC( int, p->pData, p->nSize ); 
    }
    p->pData[p->iTail++] = iObj;
}